

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O3

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::AddResult
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Result *result)

{
  pointer *ppRVar1;
  btree_set<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256>
  *this_00;
  double dVar2;
  int iVar3;
  int iVar4;
  iterator __position;
  S1ChordAngle SVar5;
  int32 iVar6;
  int32 iVar7;
  Options *pOVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  iterator iVar11;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>,_bool>
  local_30;
  
  pOVar8 = this->options_;
  if (pOVar8->max_results_ == 0x7fffffff) {
    __position._M_current =
         (this->result_vector_).
         super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->result_vector_).
        super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
      ::_M_realloc_insert<S2ClosestEdgeQueryBase<S2MinDistance>::Result_const&>
                ((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
                  *)&this->result_vector_,__position,result);
      return;
    }
    iVar6 = result->shape_id_;
    iVar7 = result->edge_id_;
    ((__position._M_current)->distance_).super_S1ChordAngle.length2_ =
         (result->distance_).super_S1ChordAngle.length2_;
    (__position._M_current)->shape_id_ = iVar6;
    (__position._M_current)->edge_id_ = iVar7;
    ppRVar1 = &(this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  else {
    if (pOVar8->max_results_ == 1) {
      iVar6 = result->shape_id_;
      iVar7 = result->edge_id_;
      (this->result_singleton_).distance_.super_S1ChordAngle.length2_ =
           (result->distance_).super_S1ChordAngle.length2_;
      (this->result_singleton_).shape_id_ = iVar6;
      (this->result_singleton_).edge_id_ = iVar7;
      dVar2 = (result->distance_).super_S1ChordAngle.length2_;
      uVar9 = SUB84(dVar2,0);
      uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    else {
      this_00 = &this->result_set_;
      gtl::internal_btree::
      btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
      ::insert_unique<S2ClosestEdgeQueryBase<S2MinDistance>::Result_const&>
                (&local_30,
                 (btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                  *)this_00,result,result);
      iVar3 = (int)(this->result_set_).
                   super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                   .
                   super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                   .tree_.size_;
      iVar4 = this->options_->max_results_;
      if (iVar3 < iVar4) {
        return;
      }
      if (iVar4 < iVar3) {
        iVar11 = gtl::internal_btree::
                 btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 ::end((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                        *)this_00);
        local_30.first.node = iVar11.node;
        local_30.first.position = iVar11.position;
        gtl::internal_btree::
        btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
        ::decrement(&local_30.first);
        iVar11.position = local_30.first.position;
        iVar11.node = local_30.first.node;
        iVar11._12_4_ = 0;
        gtl::internal_btree::
        btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
        ::erase((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 *)this_00,iVar11);
      }
      iVar11 = gtl::internal_btree::
               btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
               ::end((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                      *)this_00);
      local_30.first.node = iVar11.node;
      local_30.first.position = iVar11.position;
      gtl::internal_btree::
      btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
      ::decrement(&local_30.first);
      if (((ulong)local_30.first.node & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                      ,0x1e1,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                     );
      }
      uVar9 = (undefined4)
              *(undefined8 *)(local_30.first.node + (long)local_30.first.position * 0x10 + 0x10);
      uVar10 = (undefined4)
               ((ulong)*(undefined8 *)
                        (local_30.first.node + (long)local_30.first.position * 0x10 + 0x10) >> 0x20)
      ;
      pOVar8 = this->options_;
    }
    SVar5.length2_._4_4_ = uVar10;
    SVar5.length2_._0_4_ = uVar9;
    SVar5 = operator-(SVar5,(pOVar8->max_error_).length2_);
    (this->distance_limit_).super_S1ChordAngle.length2_ = SVar5.length2_;
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::AddResult(const Result& result) {
  if (options().max_results() == 1) {
    // Optimization for the common case where only the closest edge is wanted.
    result_singleton_ = result;
    distance_limit_ = result.distance() - options().max_error();
  } else if (options().max_results() == Options::kMaxMaxResults) {
    result_vector_.push_back(result);  // Sort/unique at end.
  } else {
    // Add this edge to result_set_.  Note that even if we already have enough
    // edges, we can't erase an element before insertion because the "new"
    // edge might in fact be a duplicate.
    result_set_.insert(result);
    int size = result_set_.size();
    if (size >= options().max_results()) {
      if (size > options().max_results()) {
        result_set_.erase(--result_set_.end());
      }
      distance_limit_ = (--result_set_.end())->distance() -
                        options().max_error();
    }
  }
}